

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transition.cc
# Opt level: O1

int tchecker::ta::lexical_cmp(transition_t *t1,transition_t *t2)

{
  int iVar1;
  
  iVar1 = syncprod::lexical_cmp(&t1->super_transition_t,&t2->super_transition_t);
  if (iVar1 == 0) {
    iVar1 = tchecker::lexical_cmp(&t1->_src_invariant,&t2->_src_invariant);
    if (iVar1 == 0) {
      iVar1 = tchecker::lexical_cmp(&t1->_guard,&t2->_guard);
      if (iVar1 == 0) {
        iVar1 = tchecker::lexical_cmp(&t1->_reset,&t2->_reset);
        if (iVar1 == 0) {
          iVar1 = tchecker::lexical_cmp(&t1->_tgt_invariant,&t2->_tgt_invariant);
          return iVar1;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int lexical_cmp(tchecker::ta::transition_t const & t1, tchecker::ta::transition_t const & t2)
{
  int syncprod_cmp = tchecker::syncprod::lexical_cmp(t1, t2);
  if (syncprod_cmp != 0)
    return syncprod_cmp;
  int src_invariant_cmp = tchecker::lexical_cmp(t1.src_invariant_container(), t2.src_invariant_container());
  if (src_invariant_cmp != 0)
    return src_invariant_cmp;
  int guard_cmp = tchecker::lexical_cmp(t1.guard_container(), t2.guard_container());
  if (guard_cmp != 0)
    return guard_cmp;
  int reset_cmp = tchecker::lexical_cmp(t1.reset_container(), t2.reset_container());
  if (reset_cmp != 0)
    return reset_cmp;
  return tchecker::lexical_cmp(t1.tgt_invariant_container(), t2.tgt_invariant_container());
}